

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O0

ssize_t __thiscall
CVmMemorySourceList::read(CVmMemorySourceList *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  size_t in_stack_00000018;
  void *in_stack_00000020;
  CVmMemorySourceList *in_stack_00000028;
  uint local_4;
  
  if (this->len_ < this->cur_block_->ofs + this->cur_block_ofs_ + (long)__buf) {
    local_4 = 1;
  }
  else {
    iVar1 = readc(in_stack_00000028,in_stack_00000020,in_stack_00000018);
    local_4 = (uint)((void *)(long)iVar1 != __buf);
  }
  return (ulong)local_4;
}

Assistant:

int read(void *buf, size_t len)
    {
        /* 
         *   if the request would take us past the current content length,
         *   fail immediately, since we know we can't satisfy the request 
         */
        if (cur_block_->ofs + cur_block_ofs_ + (long)len > len_)
            return 1;

        /* 
         *   do the read; return success == 0 if the amount read exactly
         *   matches the requested length 
         */
        return (size_t)readc(buf, len) != len;
    }